

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

string * __thiscall
sqlite_orm::internal::
table_t<relive::Stream,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<...:constraints::foreign_key_t<std::tuple<long_relive::Stream::*>,std::tuple<long_relive::Station::*>>>
::find_column_name<long,relive::Stream,void>(table_t<_fff27d53_> *this,offset_in_Stream_to_long m)

{
  table_t<_fff27d53_> *in_RDI;
  string *res;
  table_t<_fff27d53_> *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  for_each_column_with_field_type<long,sqlite_orm::internal::table_t<relive::Stream,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream___:*>>>__find_column_name<long,relive::Stream,void>_long_relive__Stream____const___lambda_auto_1___1_>
            (this_00,(anon_class_16_2_de34c1f6 *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }